

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O3

bool __thiscall
iDynTree::InverseKinematics::addTarget
          (InverseKinematics *this,string *frameName,MatrixView<const_double> *targetValue,
          double positionWeight,double rotationWeight)

{
  char *pcVar1;
  char *pcVar2;
  MatrixView<const_double> local_118;
  Transform local_e8 [96];
  MatrixFixSize local_88 [128];
  
  if ((targetValue->m_rows == 4) && (targetValue->m_cols == 4)) {
    local_118.m_storage = targetValue->m_storage;
    local_118.m_rows = 4;
    local_118.m_cols = 4;
    local_118.m_storageOrder = targetValue->m_storageOrder;
    local_118.m_innerStride = targetValue->m_innerStride;
    local_118.m_outerStride = targetValue->m_outerStride;
    MatrixFixSize<4U,_4U>::MatrixFixSize((MatrixFixSize<4U,_4U> *)local_88,&local_118);
    iDynTree::Transform::Transform(local_e8,local_88);
    pcVar2 = "";
    pcVar1 = "IDYNTREE_USES_IPOPT CMake option need to be set to ON to use InverseKinematics";
  }
  else {
    pcVar2 = "addTarget";
    pcVar1 = "Wrong size in input targetValue";
  }
  iDynTree::reportError("InverseKinematics",pcVar2,pcVar1);
  return false;
}

Assistant:

bool InverseKinematics::addTarget(const std::string& frameName,
                                      iDynTree::MatrixView<const double> targetValue,
                                      const double positionWeight,
                                      const double rotationWeight)
    {
        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        bool ok = (targetValue.rows() == expected_transform_rows)
                  && (targetValue.cols() == expected_transform_cols);
        if (!ok)
        {
            reportError("InverseKinematics",
                        "addTarget",
                        "Wrong size in input targetValue");
            return false;
        }

        return this->addTarget(frameName, Transform(targetValue), positionWeight, rotationWeight);
    }